

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
          (void *this,Type type,Wasm2JSBuilder *parent,Function *func,IString possible)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = possible.str._M_str;
  *(Wasm2JSBuilder **)this = parent;
  *(uintptr_t *)((long)this + 8) = type.id;
  *(undefined8 *)((long)this + 0x10) = 0;
  *(undefined8 *)((long)this + 0x18) = 0;
  if (DAT_00da8850 == pcVar1) {
    __assert_fail("possible != EXPRESSION_RESULT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,0x459,
                  "wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::ScopedTemp::ScopedTemp(Type, Wasm2JSBuilder *, Function *, IString)"
                 );
  }
  bVar2 = DAT_00da8840 == pcVar1;
  if (bVar2) {
    possible = getTemp(parent,type,func);
  }
  *(string_view *)((long)this + 0x10) = possible.str;
  *(bool *)((long)this + 0x20) = bVar2;
  return;
}

Assistant:

ScopedTemp(Type type,
                 Wasm2JSBuilder* parent,
                 Function* func,
                 IString possible = NO_RESULT)
        : parent(parent), type(type) {
        assert(possible != EXPRESSION_RESULT);
        if (possible == NO_RESULT) {
          temp = parent->getTemp(type, func);
          needFree = true;
        } else {
          temp = possible;
          needFree = false;
        }
      }